

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LoopGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopGenerateSyntax,slang::syntax::LoopGenerateSyntax_const&>
          (BumpAllocator *this,LoopGenerateSyntax *args)

{
  LoopGenerateSyntax *pLVar1;
  LoopGenerateSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pLVar1 = (LoopGenerateSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::LoopGenerateSyntax::LoopGenerateSyntax(in_RSI,pLVar1);
  return pLVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }